

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

ostream * maths::operator<<(ostream *os,Matrix *m)

{
  long lVar1;
  long lVar2;
  
  if (0 < m->rows_) {
    lVar1 = 0;
    do {
      std::ostream::_M_insert<double>(*m->p[lVar1]);
      if (1 < m->cols_) {
        lVar2 = 1;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          std::ostream::_M_insert<double>(m->p[lVar1][lVar2]);
          lVar2 = lVar2 + 1;
        } while (lVar2 < m->cols_);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
      std::ostream::put((char)os);
      std::ostream::flush();
      lVar1 = lVar1 + 1;
    } while (lVar1 < m->rows_);
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const Matrix& m)
{
    for (int i = 0; i < m.rows_; ++i) {
        os << m.p[i][0];
        for (int j = 1; j < m.cols_; ++j) {
            os << " " << m.p[i][j];
        }
        os << endl;
    }
    return os;
}